

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product.h
# Opt level: O0

void __thiscall Shoes::~Shoes(Shoes *this)

{
  code *pcVar1;
  Shoes *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Shoes() {}